

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlLocationSetPtr xmlXPtrLocationSetCreate(xmlXPathObjectPtr val)

{
  xmlXPathObjectType xVar1;
  xmlNodeSetPtr pxVar2;
  xmlLocationSetPtr ret;
  xmlXPathObjectPtr val_local;
  
  val_local = (xmlXPathObjectPtr)(*xmlMalloc)(0x10);
  if (val_local == (xmlXPathObjectPtr)0x0) {
    xmlXPtrErrMemory("allocating locationset");
    val_local = (xmlXPathObjectPtr)0x0;
  }
  else {
    memset(val_local,0,0x10);
    if (val != (xmlXPathObjectPtr)0x0) {
      pxVar2 = (xmlNodeSetPtr)(*xmlMalloc)(0x50);
      val_local->nodesetval = pxVar2;
      if (val_local->nodesetval == (xmlNodeSetPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
        (*xmlFree)(val_local);
        val_local = (xmlXPathObjectPtr)0x0;
      }
      else {
        memset(val_local->nodesetval,0,0x50);
        *(undefined4 *)&val_local->field_0x4 = 10;
        xVar1 = val_local->type;
        val_local->type = xVar1 + XPATH_NODESET;
        *(xmlXPathObjectPtr *)(&val_local->nodesetval->nodeNr + (long)(int)xVar1 * 2) = val;
      }
    }
  }
  return (xmlLocationSetPtr)val_local;
}

Assistant:

xmlLocationSetPtr
xmlXPtrLocationSetCreate(xmlXPathObjectPtr val) {
    xmlLocationSetPtr ret;

    ret = (xmlLocationSetPtr) xmlMalloc(sizeof(xmlLocationSet));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating locationset");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlLocationSet));
    if (val != NULL) {
        ret->locTab = (xmlXPathObjectPtr *) xmlMalloc(XML_RANGESET_DEFAULT *
					     sizeof(xmlXPathObjectPtr));
	if (ret->locTab == NULL) {
	    xmlXPtrErrMemory("allocating locationset");
	    xmlFree(ret);
	    return(NULL);
	}
	memset(ret->locTab, 0 ,
	       XML_RANGESET_DEFAULT * (size_t) sizeof(xmlXPathObjectPtr));
        ret->locMax = XML_RANGESET_DEFAULT;
	ret->locTab[ret->locNr++] = val;
    }
    return(ret);
}